

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_buffer_encode(aec_stream *strm)

{
  aec_stream *in_RDI;
  int status;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  local_4 = aec_encode_init((aec_stream *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (local_4 == 0) {
    local_4 = aec_encode(in_RDI,0);
    if (local_4 == 0) {
      local_4 = aec_encode_end(in_RDI);
    }
    else {
      cleanup((EVP_PKEY_CTX *)in_RDI);
    }
  }
  return local_4;
}

Assistant:

int aec_buffer_encode(struct aec_stream *strm)
{
    int status;

    status = aec_encode_init(strm);
    if (status != AEC_OK)
        return status;
    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        cleanup(strm);
        return status;
    }
    return aec_encode_end(strm);
}